

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O3

int Hop_ObjIsMuxType(Hop_Obj_t *pNode)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  if (((ulong)pNode & 1) == 0) {
    uVar3 = 0;
    uVar1 = 0;
    if (((((*(uint *)&pNode->field_0x20 & 7) == 4) &&
         (uVar1 = uVar3, ((ulong)pNode->pFanin0 & 1) != 0)) && (((ulong)pNode->pFanin1 & 1) != 0))
       && ((uVar2 = (ulong)pNode->pFanin0 & 0xfffffffffffffffe, (*(uint *)(uVar2 + 0x20) & 7) == 4
           && (uVar5 = (ulong)pNode->pFanin1 & 0xfffffffffffffffe,
              (*(uint *)(uVar5 + 0x20) & 7) == 4)))) {
      uVar9 = *(ulong *)(uVar2 + 0x10) & 0xfffffffffffffffe;
      uVar6 = *(ulong *)(uVar5 + 0x10) & 0xfffffffffffffffe;
      uVar3 = (uint)*(ulong *)(uVar5 + 0x10);
      uVar8 = (uint)*(ulong *)(uVar2 + 0x10);
      if ((uVar9 != uVar6) || (uVar1 = 1, ((uVar3 ^ uVar8) & 1) == 0)) {
        uVar7 = *(ulong *)(uVar5 + 0x18) & 0xfffffffffffffffe;
        uVar4 = (uint)*(ulong *)(uVar5 + 0x18);
        if ((uVar9 != uVar7) || (uVar1 = 1, ((uVar8 ^ uVar4) & 1) == 0)) {
          uVar5 = *(ulong *)(uVar2 + 0x18) & 0xfffffffffffffffe;
          uVar8 = (uint)*(ulong *)(uVar2 + 0x18);
          if (((uVar5 != uVar6) || (uVar1 = 1, ((uVar3 ^ uVar8) & 1) == 0)) &&
             (uVar1 = 0, uVar5 == uVar7)) {
            uVar1 = (uVar8 ^ uVar4) & 1;
          }
        }
      }
    }
    return uVar1;
  }
  __assert_fail("!Hop_IsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopUtil.c"
                ,0x9b,"int Hop_ObjIsMuxType(Hop_Obj_t *)");
}

Assistant:

int Hop_ObjIsMuxType( Hop_Obj_t * pNode )
{
    Hop_Obj_t * pNode0, * pNode1;
    // check that the node is regular
    assert( !Hop_IsComplement(pNode) );
    // if the node is not AND, this is not MUX
    if ( !Hop_ObjIsAnd(pNode) )
        return 0;
    // if the children are not complemented, this is not MUX
    if ( !Hop_ObjFaninC0(pNode) || !Hop_ObjFaninC1(pNode) )
        return 0;
    // get children
    pNode0 = Hop_ObjFanin0(pNode);
    pNode1 = Hop_ObjFanin1(pNode);
    // if the children are not ANDs, this is not MUX
    if ( !Hop_ObjIsAnd(pNode0) || !Hop_ObjIsAnd(pNode1) )
        return 0;
    // otherwise the node is MUX iff it has a pair of equal grandchildren
    return (Hop_ObjFanin0(pNode0) == Hop_ObjFanin0(pNode1) && (Hop_ObjFaninC0(pNode0) ^ Hop_ObjFaninC0(pNode1))) || 
           (Hop_ObjFanin0(pNode0) == Hop_ObjFanin1(pNode1) && (Hop_ObjFaninC0(pNode0) ^ Hop_ObjFaninC1(pNode1))) ||
           (Hop_ObjFanin1(pNode0) == Hop_ObjFanin0(pNode1) && (Hop_ObjFaninC1(pNode0) ^ Hop_ObjFaninC0(pNode1))) ||
           (Hop_ObjFanin1(pNode0) == Hop_ObjFanin1(pNode1) && (Hop_ObjFaninC1(pNode0) ^ Hop_ObjFaninC1(pNode1)));
}